

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

void __thiscall
spvtools::opt::Loop::GetExitBlocks
          (Loop *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *exit_blocks)

{
  CFG *this_00;
  BasicBlock *this_01;
  __node_base *p_Var1;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_00 = IRContext::cfg(this->context_);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&exit_blocks->_M_h);
  p_Var1 = &(this->loop_basic_blocks_)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    this_01 = CFG::block(this_00,(uint32_t)*(size_type *)(p_Var1 + 1));
    local_38 = std::
               _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:358:31)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:358:31)>
               ::_M_manager;
    local_50._M_unused._M_object = exit_blocks;
    local_50._8_8_ = this;
    BasicBlock::ForEachSuccessorLabel(this_01,(function<void_(unsigned_int)> *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
  }
  return;
}

Assistant:

void Loop::GetExitBlocks(std::unordered_set<uint32_t>* exit_blocks) const {
  CFG* cfg = context_->cfg();
  exit_blocks->clear();

  for (uint32_t bb_id : GetBlocks()) {
    const BasicBlock* bb = cfg->block(bb_id);
    bb->ForEachSuccessorLabel([exit_blocks, this](uint32_t succ) {
      if (!IsInsideLoop(succ)) {
        exit_blocks->insert(succ);
      }
    });
  }
}